

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O3

void __thiscall ImVector<unsigned_short>::resize(ImVector<unsigned_short> *this,int new_size)

{
  unsigned_short *__dest;
  int iVar1;
  
  iVar1 = this->Capacity;
  if (iVar1 < new_size) {
    if (iVar1 == 0) {
      iVar1 = 8;
    }
    else {
      iVar1 = iVar1 / 2 + iVar1;
    }
    if (iVar1 <= new_size) {
      iVar1 = new_size;
    }
    __dest = (unsigned_short *)ImGui::MemAlloc((long)iVar1 * 2);
    if (this->Data != (unsigned_short *)0x0) {
      memcpy(__dest,this->Data,(long)this->Size * 2);
      ImGui::MemFree(this->Data);
    }
    this->Data = __dest;
    this->Capacity = iVar1;
  }
  this->Size = new_size;
  return;
}

Assistant:

inline int          _grow_capacity(int sz) const        { int new_capacity = Capacity ? (Capacity + Capacity / 2) : 8; return new_capacity > sz ? new_capacity : sz; }